

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O1

spectral_operation __thiscall
kitty::detail::spectrum::spectral_translation(spectrum *this,int i,int j)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  piVar2 = (this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar3 != 0) {
    uVar5 = 0;
    do {
      uVar4 = (uint)uVar5;
      if ((uVar4 & j) == 0 && (uVar4 & i) != 0) {
        iVar1 = piVar2[uVar5];
        piVar2[uVar5] = piVar2[j + uVar4];
        piVar2[j + uVar4] = iVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar3 >> 2));
  }
  return (spectral_operation)(((uint6)(uint)j << 0x20) + (uint6)(uint)(i << 0x10) + 4);
}

Assistant:

auto spectral_translation( int i, int j )
  {
    spectral_operation op( spectral_operation::kind::spectral_translation, i, j );

    for ( auto k = 0u; k < _s.size(); ++k )
    {
      if ( ( k & i ) > 0 && ( k & j ) == 0 )
      {
        std::swap( _s[k], _s[k + j] );
      }
    }

    return op;
  }